

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall SVGChart::PPlot::CalculateTickInfo(PPlot *this,PRect *inRect,Painter *inPainter)

{
  TickInfo *ioTickInfo;
  TickInfo *ioTickInfo_00;
  float fVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PPlot *this_00;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = (this->mXAxisSetup).mMax - (this->mXAxisSetup).mMin;
  if (fVar5 <= 0.0) {
    return false;
  }
  fVar4 = (this->mYAxisSetup).mMin;
  fVar1 = (this->mYAxisSetup).mMax;
  fVar6 = fVar1 - fVar4;
  if (fVar6 < 0.0) {
    return false;
  }
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if ((ABS(fVar6 / fVar1) < 0.001) || ((fVar6 == 0.0 && (!NAN(fVar6))))) {
      fVar6 = ABS(fVar1) * 0.1;
      goto LAB_00106efa;
    }
  }
  else if ((fVar6 == 0.0) && (!NAN(fVar6))) {
    fVar6 = 0.1;
LAB_00106efa:
    (this->mYAxisSetup).mMax = fVar1 + fVar6;
    fVar4 = fVar4 - fVar6;
    (this->mYAxisSetup).mMin = fVar4;
    fVar6 = (fVar1 + fVar6) - fVar4;
  }
  ioTickInfo = &(this->mXAxisSetup).mTickInfo;
  if ((this->mXAxisSetup).mTickInfo.mAutoTick == true) {
    iVar3 = (*inPainter->_vptr_Painter[8])(inPainter,"12345");
    iVar3 = (*this->mXTickIterator->_vptr_TickIterator[4])
                      (fVar5,(float)inRect->mH,(float)inRect->mW / ((float)iVar3 + (float)iVar3),
                       this->mXTickIterator,ioTickInfo);
    if ((char)iVar3 != '\0') goto LAB_00106f7e;
LAB_00106ffd:
    bVar2 = false;
  }
  else {
LAB_00106f7e:
    ioTickInfo_00 = &(this->mYAxisSetup).mTickInfo;
    if ((this->mYAxisSetup).mTickInfo.mAutoTick == true) {
      iVar3 = (*inPainter->_vptr_Painter[9])(inPainter);
      iVar3 = (*this->mYTickIterator->_vptr_TickIterator[4])
                        (fVar6,(float)inRect->mW,
                         (float)inRect->mH / ((float)CONCAT44(extraout_var,iVar3) * 3.0),
                         this->mYTickIterator,ioTickInfo_00);
      if ((char)iVar3 == '\0') goto LAB_00106ffd;
    }
    this_00 = (PPlot *)inPainter;
    iVar3 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes(this_00,iVar3,ioTickInfo);
    iVar3 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes((PPlot *)inPainter,iVar3,ioTickInfo_00);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool PPlot::CalculateTickInfo (const PRect &inRect, Painter &inPainter) {
      float theXRange = mXAxisSetup.mMax - mXAxisSetup.mMin;
      float theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;

      if (theXRange <= 0 || theYRange < 0) {
        return false;
      }

      if ((mYAxisSetup.mMax != 0 && fabs (theYRange / mYAxisSetup.mMax) < kRangeVerySmall) ||
        theYRange == 0) {
        float delta = 0.1f;
        if (mYAxisSetup.mMax != 0) {
            delta *= fabs(mYAxisSetup.mMax);
        }
        
        mYAxisSetup.mMax += delta;
        mYAxisSetup.mMin -= delta;
        theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;
      }

      if (mXAxisSetup.mTickInfo.mAutoTick) {
        int theTextWidth = inPainter.CalculateTextDrawSize ("12345");
        float theDivGuess = inRect.mW/(kMajorTickXInitialFac*theTextWidth);
        if (!mXTickIterator->InitFromRanges (theXRange, inRect.mH, theDivGuess, mXAxisSetup.mTickInfo)) {
          return false;
        }
      }
      if (mYAxisSetup.mTickInfo.mAutoTick) {
        float theTextHeight = inPainter.GetFontHeight ();
        float theDivGuess = inRect.mH/(kMajorTickYInitialFac*theTextHeight);
        if (!mYTickIterator->InitFromRanges (theYRange, inRect.mW, theDivGuess, mYAxisSetup.mTickInfo)) {
          return false;
        }
      }

      SetTickSizes (inPainter.GetFontHeight (), mXAxisSetup.mTickInfo);
      SetTickSizes (inPainter.GetFontHeight (), mYAxisSetup.mTickInfo);

      return true;
    }